

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int Init12Video(void)

{
  SDL20_AllocFormat_t p_Var1;
  int iVar2;
  SDL_bool SVar3;
  SDL_PixelFormatEnum SVar4;
  uint uVar5;
  char *driver_00;
  char *pcVar6;
  bool bVar7;
  int local_44;
  undefined1 local_40 [4];
  int i;
  SDL_DisplayMode mode;
  uint max_bpp;
  char *scale_method_env;
  char *driver;
  
  driver_00 = (*SDL20_GetCurrentVideoDriver)();
  pcVar6 = SDL12Compat_GetHint("SDL12COMPAT_SCALE_METHOD");
  mode.driverdata._4_4_ = SDL12Compat_GetHintInt("SDL12COMPAT_MAX_BPP",0x20);
  AllowThreadedDraws = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_THREADED_DRAWS",SDL_TRUE);
  AllowThreadedPumps = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_THREADED_PUMPS",SDL_TRUE);
  bVar7 = false;
  if (pcVar6 != (char *)0x0) {
    iVar2 = (*SDL20_strcmp)(pcVar6,"nearest");
    bVar7 = iVar2 == 0;
  }
  WantScaleMethodNearest = (SDL_bool)bVar7;
  TranslateKeyboardLayout =
       SDL12Compat_GetHintBoolean("SDL12COMPAT_USE_KEYBOARD_LAYOUT",TranslateKeyboardLayout);
  bVar7 = false;
  if (driver_00 != (char *)0x0) {
    iVar2 = (*SDL20_strcmp)(driver_00,"dummy");
    bVar7 = iVar2 == 0;
  }
  IsDummyVideo = (SDL_bool)bVar7;
  EventQueueMutex = (*SDL20_CreateMutex)();
  if (EventQueueMutex == (SDL_mutex *)0x0) {
    driver._4_4_ = -1;
  }
  else {
    for (local_44 = 0; local_44 < 0x7f; local_44 = local_44 + 1) {
      EventQueuePool[local_44].next = EventQueuePool + (local_44 + 1);
    }
    EventQueuePool[0x7f].next = (EventQueueType *)0x0;
    EventQueueTail = (EventQueueType *)0x0;
    EventQueueHead = (EventQueueType *)0x0;
    EventQueueAvailable = EventQueuePool;
    (*SDL20_memset)(&PendingKeydownEvent,0,0x18);
    (*SDL20_memset)(EventStates,1,0x20);
    EventStates[0xd] = '\0';
    (*SDL20_EventState)(0x201,0);
    iVar2 = (*SDL20_strcmp)(driver_00,"x11");
    SupportSysWM = (SDL_bool)(iVar2 == 0);
    SVar3 = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_SYSWM",SDL_TRUE);
    if (SVar3 == SDL_FALSE) {
      SupportSysWM = SDL_FALSE;
    }
    SDL_EnableKeyRepeat(0,0);
    (*SDL20_DelEventWatch)(EventFilter20to12,(void *)0x0);
    (*SDL20_AddEventWatch)(EventFilter20to12,(void *)0x0);
    VideoDisplayIndex = GetVideoDisplay();
    SwapInterval = 0;
    VideoWindowGrabbed = SDL_FALSE;
    VideoCursorHidden = SDL_FALSE;
    (*SDL20_ShowCursor)(1);
    iVar2 = Init12VidModes();
    if (iVar2 < 0) {
      driver._4_4_ = -1;
    }
    else {
      (*SDL20_StopTextInput)();
      iVar2 = (*SDL20_GetDesktopDisplayMode)(VideoDisplayIndex,(SDL_DisplayMode *)local_40);
      p_Var1 = SDL20_AllocFormat;
      if (iVar2 == 0) {
        if (mode.driverdata._4_4_ < ((uint)local_40 >> 8 & 0xff)) {
          SVar4 = BPPToPixelFormat(mode.driverdata._4_4_);
          VideoInfoVfmt20 = (*p_Var1)(SVar4);
        }
        else {
          VideoInfoVfmt20 = (*SDL20_AllocFormat)((Uint32)local_40);
        }
        VideoInfo12.vfmt = PixelFormat20to12(&VideoInfoVfmt12,&VideoInfoPalette12,VideoInfoVfmt20);
        VideoInfo12.current_w = i;
        VideoInfo12.current_h = mode.format;
        uVar5 = HasWmAvailable(driver_00);
        VideoInfo12._0_4_ = VideoInfo12._0_4_ & 0xfffffffd | (uVar5 & 1) << 1;
        VideoInfo12.video_mem = 0x40000;
      }
      driver._4_4_ = 0;
    }
  }
  return driver._4_4_;
}

Assistant:

static int
Init12Video(void)
{
    const char *driver = SDL20_GetCurrentVideoDriver();
    const char *scale_method_env = SDL12Compat_GetHint("SDL12COMPAT_SCALE_METHOD");
    const unsigned max_bpp = SDL12Compat_GetHintInt("SDL12COMPAT_MAX_BPP", 32);
    SDL_DisplayMode mode;
    int i;

    AllowThreadedDraws = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_THREADED_DRAWS", SDL_TRUE);
    AllowThreadedPumps = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_THREADED_PUMPS", SDL_TRUE);

    WantScaleMethodNearest = (scale_method_env && !SDL20_strcmp(scale_method_env, "nearest")) ? SDL_TRUE : SDL_FALSE;

    /* Only override this if the env var is set, as the default is platform-specific. */
    TranslateKeyboardLayout = SDL12Compat_GetHintBoolean("SDL12COMPAT_USE_KEYBOARD_LAYOUT", TranslateKeyboardLayout);

    IsDummyVideo = ((driver != NULL) && (SDL20_strcmp(driver, "dummy") == 0)) ? SDL_TRUE : SDL_FALSE;

    EventQueueMutex = SDL20_CreateMutex();
    if (EventQueueMutex == NULL) {
        return -1;
    }

    for (i = 0; i < SDL12_MAXEVENTS-1; i++) {
        EventQueuePool[i].next = &EventQueuePool[i+1];
    }
    EventQueuePool[SDL12_MAXEVENTS-1].next = NULL;

    EventQueueHead = EventQueueTail = NULL;
    EventQueueAvailable = EventQueuePool;

    SDL20_memset(&PendingKeydownEvent, 0, sizeof(SDL12_Event));

    SDL20_memset(EventStates, SDL_ENABLE, sizeof (EventStates)); /* on by default */

    EventStates[SDL12_SYSWMEVENT] = SDL_IGNORE;  /* off by default. */
    SDL20_EventState(SDL_SYSWMEVENT, SDL_IGNORE);

#if defined(SDL_VIDEO_DRIVER_WINDOWS)
    SupportSysWM = (SDL20_strcmp(driver, "windows") == 0) ? SDL_TRUE : SDL_FALSE;
#elif defined(SDL_VIDEO_DRIVER_X11)
    SupportSysWM = (SDL20_strcmp(driver, "x11") == 0) ? SDL_TRUE : SDL_FALSE;
#else
    SupportSysWM = SDL_FALSE;
#endif

    if (!SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_SYSWM", SDL_TRUE)) {
        SupportSysWM = SDL_FALSE;
    }

    SDL_EnableKeyRepeat(0, 0);

    SDL20_DelEventWatch(EventFilter20to12, NULL);
    SDL20_AddEventWatch(EventFilter20to12, NULL);

    VideoDisplayIndex = GetVideoDisplay();
    SwapInterval = 0;

    VideoWindowGrabbed = SDL_FALSE;
    VideoCursorHidden = SDL_FALSE;
    SDL20_ShowCursor(1);

    if (Init12VidModes() < 0) {
        return -1;
    }

    SDL20_StopTextInput();

    if (SDL20_GetDesktopDisplayMode(VideoDisplayIndex, &mode) == 0) {
        if (SDL_BITSPERPIXEL(mode.format) > max_bpp) {
            VideoInfoVfmt20 = SDL20_AllocFormat(BPPToPixelFormat(max_bpp));
        } else {
            VideoInfoVfmt20 = SDL20_AllocFormat(mode.format);
        }
        VideoInfo12.vfmt = PixelFormat20to12(&VideoInfoVfmt12, &VideoInfoPalette12, VideoInfoVfmt20);
        VideoInfo12.current_w = mode.w;
        VideoInfo12.current_h = mode.h;
        VideoInfo12.wm_available = HasWmAvailable(driver);
        VideoInfo12.video_mem = 1024 * 256;  /* good enough. */
    }

    return 0;
}